

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_entropy.c
# Opt level: O0

RK_U32 update_prob(RK_U32 prob,RK_U32 left,RK_U32 right,RK_U32 old_prob,RK_U32 new_prob,RK_U32 fixed
                  )

{
  RK_S32 s;
  RK_S32 u;
  RK_U32 fixed_local;
  RK_U32 new_prob_local;
  RK_U32 old_prob_local;
  RK_U32 right_local;
  RK_U32 left_local;
  RK_U32 prob_local;
  
  return (RK_U32)((int)(fixed + (vp8_prob_cost_tbl[0xff - prob] - vp8_prob_cost_tbl[prob] >> 8)) <
                 (int)(left * (vp8_prob_cost_tbl[old_prob] - vp8_prob_cost_tbl[new_prob]) +
                      right * (vp8_prob_cost_tbl[0xff - old_prob] -
                              vp8_prob_cost_tbl[0xff - new_prob])) >> 8);
}

Assistant:

static RK_U32 update_prob(RK_U32 prob, RK_U32 left, RK_U32 right,
                          RK_U32 old_prob, RK_U32 new_prob, RK_U32 fixed)
{
    RK_S32 u, s;

    u = (RK_S32)fixed + ((vp8_prob_cost_tbl[255 - prob] - vp8_prob_cost_tbl[prob]) >> 8);
    s = ((RK_S32)left * (vp8_prob_cost_tbl[old_prob] - vp8_prob_cost_tbl[new_prob]) +
         (RK_S32)right * (vp8_prob_cost_tbl[255 - old_prob] - vp8_prob_cost_tbl[255 - new_prob])) >> 8;

    return (s > u);
}